

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void duckdb::
     HistogramFunction<duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
     ::
     Combine<duckdb::HistogramAggState<duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>,duckdb::HistogramFunction<duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>>
               (HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
                *source,HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
                        *target,AggregateInputData *input_data)

{
  ArenaAllocator *pAVar1;
  _Hash_node_base *p_Var2;
  OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *pOVar3;
  mapped_type *pmVar4;
  _Hash_node_base *p_Var5;
  
  if (source->hist !=
      (OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
       *)0x0) {
    if (target->hist ==
        (OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *)0x0) {
      pAVar1 = input_data->allocator;
      pOVar3 = (OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
                *)operator_new(0x48);
      pOVar3->allocator = &pAVar1->arena_allocator;
      (pOVar3->map)._M_h._M_buckets = &(pOVar3->map)._M_h._M_single_bucket;
      (pOVar3->map)._M_h._M_bucket_count = 1;
      (pOVar3->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pOVar3->map)._M_h._M_element_count = 0;
      (pOVar3->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (pOVar3->map)._M_h._M_rehash_policy._M_next_resize = 0;
      (pOVar3->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pOVar3->free_type = DOES_NOT_REQUIRE_FREE;
      target->hist = pOVar3;
    }
    for (p_Var5 = (source->hist->map)._M_h._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
        p_Var5 = p_Var5->_M_nxt) {
      p_Var2 = p_Var5[3]._M_nxt;
      pmVar4 = OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
               ::GetOrCreate(target->hist,
                             (key_type)((anon_union_16_2_67f50693_for_value *)(p_Var5 + 1))->pointer
                            );
      *pmVar4 = (long)&p_Var2->_M_nxt + *pmVar4;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.hist) {
			return;
		}
		if (!target.hist) {
			target.hist = MAP_TYPE::CreateEmpty(input_data.allocator);
		}
		for (auto &entry : *source.hist) {
			(*target.hist)[entry.first] += entry.second;
		}
	}